

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddCurrentError(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *this,SchemaErrorCode code,PointerType *location)

{
  GValue *this_00;
  StringRefType *pSVar1;
  Data local_48;
  StringRefType local_30;
  
  this_00 = &this->currentError_;
  pSVar1 = GetErrorCodeString();
  local_30.s = pSVar1->s;
  local_30.length = pSVar1->length;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  AddMember<rapidjson::SchemaErrorCode>(this_00,&local_30,code,this->allocator_);
  AddErrorInstanceLocation(this,this_00,location);
  pSVar1 = GetSchemaErrorKeyword(code);
  local_48.s.str = (Ch *)((ulong)pSVar1->s | 0x405000000000000);
  local_48.s.hashcode = 0;
  local_48.s.length = pSVar1->length;
  AddError(this,(GValue *)&local_48.s,this_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s);
  return;
}

Assistant:

void AddCurrentError(const SchemaErrorCode code, const PointerType& location) {
      RAPIDJSON_SCHEMA_PRINT(InvalidKeyword, GetSchemaErrorKeyword(code));
      currentError_.AddMember(GetErrorCodeString(), code, *allocator_);
      AddErrorInstanceLocation(currentError_, location);
      AddError(GValue(GetSchemaErrorKeyword(code)).Move(), currentError_);
    }